

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O0

size_t mjs::test_spec_runner::run
                 (gc_heap *h,vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *specs,
                 block_statement *statements)

{
  source_extend *psVar1;
  value local_b8;
  undefined1 local_90 [8];
  test_spec_runner tsr;
  block_statement *statements_local;
  vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *specs_local;
  gc_heap *h_local;
  
  tsr.last_result_.target._M_str = (wchar_t *)statements;
  test_spec_runner((test_spec_runner *)local_90,h,specs,statements);
  interpreter::eval(&local_b8,
                    (interpreter *)
                    &tsr.source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,(statement *)tsr.last_result_.target._M_str);
  value::~value(&local_b8);
  psVar1 = syntax_node::extend((syntax_node *)tsr.last_result_.target._M_str);
  check_test_spec_done((test_spec_runner *)local_90,psVar1->end);
  ~test_spec_runner((test_spec_runner *)local_90);
  return (size_t)(__uniq_ptr_data<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>,_true,_true>
                  )tsr.i_.impl_._M_t.
                   super___uniq_ptr_impl<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mjs::interpreter::impl_*,_std::default_delete<mjs::interpreter::impl>_>
                   .super__Head_base<0UL,_mjs::interpreter::impl_*,_false>._M_head_impl;
}

Assistant:

static size_t run(gc_heap& h, const std::vector<test_spec>& specs, const block_statement& statements) {
#ifdef TEST_SPEC_DEBUG
        std::wcout << "Running test spec for " << statements.extend().file->text() << "\n";
        std::wcout << "Parsed:\n";
        print(std::wcout, statements);
        std::wcout << "Specs:\n";
        for (const auto& s: specs) {
            std::wcout << pos_w << s.position << " " << s.expected.type() << " " << to_string(h, s.expected) << "\n";
        }
        std::wcout << "\n";
#endif
        test_spec_runner tsr{h, specs, statements};
        tsr.i_.eval(statements);
        tsr.check_test_spec_done(statements.extend().end);
#ifdef TEST_SPEC_DEBUG
        std::wcout << "\n";
#endif
        return tsr.index_;
    }